

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.cpp
# Opt level: O3

void __thiscall
piksel::BaseApp::updateFramebufferSize(BaseApp *this,int framebufferWidth,int framebufferHeight)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  
  this->framebufferWidth = framebufferWidth;
  this->framebufferHeight = framebufferHeight;
  (*glad_glViewport)(0,0,framebufferWidth,framebufferHeight);
  uVar1 = this->width;
  uVar2 = this->height;
  fVar3 = (float)(int)uVar1;
  fVar4 = (float)(int)uVar2;
  auVar6._8_4_ = fVar3;
  auVar6._4_4_ = fVar3;
  auVar6._12_4_ = fVar3;
  auVar6._0_4_ = (float)framebufferWidth;
  auVar7._4_4_ = fVar4;
  auVar7._0_4_ = (float)framebufferHeight;
  auVar7._8_8_ = 0;
  auVar7 = divps(auVar6,auVar7);
  fVar5 = auVar7._0_4_;
  fVar8 = auVar7._4_4_;
  if (fVar8 <= fVar5) {
    fVar3 = (fVar5 / fVar8) * fVar3;
    fVar8 = -(fVar3 + 0.0) / fVar3;
    fVar5 = fVar4;
  }
  else {
    fVar4 = fVar4 * (fVar8 / fVar5);
    fVar8 = -fVar3 / fVar3;
    fVar5 = fVar4 + 0.0;
  }
  (this->projectionMatrix).value[0].field_0.field_0.x = 2.0 / fVar3;
  *(undefined8 *)((long)&(this->projectionMatrix).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->projectionMatrix).value[0].field_0 + 0xc) = 0;
  (this->projectionMatrix).value[1].field_0.field_0.y = 2.0 / (0.0 - fVar4);
  *(undefined8 *)((long)&(this->projectionMatrix).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->projectionMatrix).value[2].field_0 = 0;
  *(undefined8 *)((long)&(this->projectionMatrix).value[2].field_0 + 8) = 0xbf800000;
  (this->projectionMatrix).value[3].field_0.field_0.x = fVar8;
  (this->projectionMatrix).value[3].field_0.field_0.y = -fVar5 / (0.0 - fVar4);
  *(undefined8 *)((long)&(this->projectionMatrix).value[3].field_0 + 8) = 0x3f80000000000000;
  return;
}

Assistant:

void BaseApp::updateFramebufferSize(int framebufferWidth, int framebufferHeight) {
    this->framebufferWidth = framebufferWidth;
    this->framebufferHeight = framebufferHeight;
    glViewport(0, 0, framebufferWidth, framebufferHeight);
    float framebufferRatio = framebufferWidth / (float) framebufferHeight;
    float ratio = width / (float) height;
    if (framebufferRatio >= ratio) {
        projectionMatrix = glm::ortho(0.0f, (framebufferRatio / ratio) * width, (float) height, 0.0f);
    } else {
        projectionMatrix = glm::ortho(0.0f, (float) width, (ratio / framebufferRatio) * height, 0.0f);
    }
#if FXAA
    if (postfx_texture) {
        glBindTexture(GL_TEXTURE_2D, postfx_texture);
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, framebufferWidth, framebufferHeight, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);
    }
#endif
}